

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::trim(Catch *this,string *str)

{
  allocator local_29;
  undefined8 local_28;
  size_type end;
  size_type start;
  string *str_local;
  
  start = (size_type)str;
  str_local = (string *)this;
  end = std::__cxx11::string::find_first_not_of((char *)str,(ulong)trim::whitespaceChars);
  local_28 = std::__cxx11::string::find_last_not_of((char *)start,(ulong)trim::whitespaceChars);
  if (end == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::string::substr((ulong)this,start);
  }
  return this;
}

Assistant:

inline std::string trim( std::string const& str ) {
        static char const* whitespaceChars = "\n\r\t ";
        std::string::size_type start = str.find_first_not_of( whitespaceChars );
        std::string::size_type end = str.find_last_not_of( whitespaceChars );

        return start != std::string::npos ? str.substr( start, 1+end-start ) : "";
    }